

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

bool __thiscall FCompressedMemFile::Open(FCompressedMemFile *this,void *memblock)

{
  (*(this->super_FCompressedFile).super_FFile._vptr_FFile[3])();
  (this->super_FCompressedFile).m_Mode = EReading;
  (this->super_FCompressedFile).m_Buffer = (uchar *)memblock;
  this->m_SourceFromMem = true;
  FCompressedFile::Explode(&this->super_FCompressedFile);
  this->m_SourceFromMem = false;
  return (this->super_FCompressedFile).m_Buffer != (uchar *)0x0;
}

Assistant:

bool FCompressedMemFile::Open (void *memblock)
{
	Close ();
	m_Mode = EReading;
	m_Buffer = (BYTE *)memblock;
	m_SourceFromMem = true;
	Explode ();
	m_SourceFromMem = false;
	return !!m_Buffer;
}